

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

uint32_t __thiscall
spirv_cross::CompilerMSL::add_meshlet_block(CompilerMSL *this,bool per_primitive)

{
  ParsedIR *this_00;
  uint uVar1;
  ID id;
  size_t sVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  Variant *pVVar4;
  undefined8 uVar5;
  bool bVar6;
  uint32_t uVar7;
  SPIRVariable *pSVar8;
  char *__end;
  long lVar9;
  long lVar10;
  SmallVector<spirv_cross::SPIRVariable_*,_8UL> vars;
  InterfaceBlockMeta meta;
  string local_218;
  SPIRType *local_1f8;
  uint32_t local_1ec;
  undefined1 local_1e8 [88];
  undefined1 local_190 [208];
  uint *local_c0;
  size_t sStack_b8;
  size_t local_b0;
  uint local_a8 [8];
  undefined1 local_88 [28];
  TypeID local_6c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_1e8._0_8_ = local_1e8 + 0x18;
  local_1e8._8_8_ = 0;
  local_1e8._16_8_ = 8;
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(this_00);
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    pTVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar9 = 0;
    do {
      uVar1 = *(uint *)((long)&pTVar3->id + lVar9);
      pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar1].type == TypeVariable) {
        pSVar8 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar1);
        if ((pSVar8->storage == StorageClassOutput) &&
           ((pSVar8->super_IVariant).self.id != this->builtin_mesh_primitive_indices_id)) {
          bVar6 = CompilerGLSL::is_per_primitive_variable(&this->super_CompilerGLSL,pSVar8);
          if (bVar6 == per_primitive) {
            SmallVector<spirv_cross::SPIRVariable_*,_8UL>::reserve
                      ((SmallVector<spirv_cross::SPIRVariable_*,_8UL> *)local_1e8,
                       local_1e8._8_8_ + 1);
            *(SPIRVariable **)(local_1e8._0_8_ + local_1e8._8_8_ * 8) = pSVar8;
            local_1e8._8_8_ = local_1e8._8_8_ + 1;
          }
        }
      }
      lVar9 = lVar9 + 4;
    } while (sVar2 << 2 != lVar9);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)local_190);
  if (local_1e8._8_8_ == 0) {
    uVar7 = 0;
  }
  else {
    local_1ec = ParsedIR::increase_bound_by(this_00,1);
    local_190._8_4_ = 0;
    local_190._0_8_ = &PTR__SPIRType_00360128;
    local_190._12_4_ = 0x1e;
    local_190._16_4_ = Unknown;
    local_190._20_4_ = 0;
    local_190._24_4_ = 1;
    local_190._28_4_ = 1;
    local_190._40_8_ = 0;
    local_190._48_8_ = (__node_base_ptr)0x8;
    local_190._96_8_ = 0;
    local_190._104_8_ = 8;
    local_190._120_4_ = 0;
    local_190[0x7c] = false;
    local_190[0x7d] = false;
    local_190._128_4_ = 0;
    local_190._132_4_ = 0;
    local_190._136_4_ = 0;
    local_190._140_4_ = 0;
    local_190._144_4_ = StorageClassGeneric;
    local_190._160_8_ = 0;
    local_190._168_8_ = 8;
    sStack_b8 = 0;
    local_b0 = 8;
    local_68._M_buckets = &local_68._M_single_bucket;
    local_88._0_7_ = 0;
    local_88._7_4_ = 0;
    local_6c.id = 0;
    local_88._12_4_ = 0;
    local_88._16_4_ = ImageFormatUnknown;
    local_88._20_4_ = AccessQualifierReadOnly;
    local_88._24_4_ = 0;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    local_190._32_8_ = local_190 + 0x38;
    local_190._88_8_ = local_190 + 0x70;
    local_190._152_8_ = (TypedID<(spirv_cross::Types)1> *)(local_190 + 0xb0);
    local_c0 = local_a8;
    local_1f8 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType>
                          ((Compiler *)this,local_1ec,(SPIRType *)local_190);
    local_190._0_8_ = &PTR__SPIRType_00360128;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    sStack_b8 = 0;
    if (local_c0 != local_a8) {
      free(local_c0);
    }
    local_190._160_8_ = 0;
    if ((TypedID<(spirv_cross::Types)1> *)local_190._152_8_ !=
        (TypedID<(spirv_cross::Types)1> *)(local_190 + 0xb0)) {
      free((void *)local_190._152_8_);
    }
    local_190._96_8_ = 0;
    if ((undefined1 *)local_190._88_8_ != local_190 + 0x70) {
      free((void *)local_190._88_8_);
    }
    local_190._40_8_ = 0;
    if ((undefined1 *)local_190._32_8_ != local_190 + 0x38) {
      free((void *)local_190._32_8_);
    }
    uVar5 = local_1e8._0_8_;
    local_1f8->basetype = Struct;
    local_190._0_8_ = local_190 + 0x30;
    local_190._8_4_ = 1;
    local_190._12_4_ = 0;
    local_190._16_4_ = Unknown;
    local_190._20_4_ = 0;
    local_190._24_4_ = 0;
    local_190._28_4_ = 0;
    local_190._32_4_ = 0x3f800000;
    local_190._40_8_ = 0;
    local_190._48_8_ = (__node_base_ptr)0x0;
    local_190[0x38] = '\0';
    local_190[0x39] = '\0';
    if (local_1e8._8_8_ != 0) {
      lVar9 = local_1e8._8_8_ << 3;
      lVar10 = 0;
      do {
        pSVar8 = *(SPIRVariable **)(uVar5 + lVar10);
        local_190[0x38] = '\x01';
        local_190[0x39] = '\0';
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"","");
        add_variable_to_interface_block
                  (this,StorageClassOutput,&local_218,local_1f8,pSVar8,
                   (InterfaceBlockMeta *)local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p);
        }
        lVar10 = lVar10 + 8;
      } while (lVar9 != lVar10);
    }
    id.id = (local_1f8->super_IVariant).self.id;
    if (per_primitive) {
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"spvPerPrimitive","");
      Compiler::set_name((Compiler *)this,id,&local_218);
    }
    else {
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"spvPerVertex","");
      Compiler::set_name((Compiler *)this,id,&local_218);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    ::std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_190);
    uVar7 = local_1ec;
  }
  local_1e8._8_8_ = 0;
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x18) {
    free((void *)local_1e8._0_8_);
  }
  return uVar7;
}

Assistant:

uint32_t CompilerMSL::add_meshlet_block(bool per_primitive)
{
	// Accumulate the variables that should appear in the interface struct.
	SmallVector<SPIRVariable *> vars;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		if (var.storage != StorageClassOutput || var.self == builtin_mesh_primitive_indices_id)
			return;
		if (is_per_primitive_variable(var) != per_primitive)
			return;
		vars.push_back(&var);
	});

	if (vars.empty())
		return 0;

	uint32_t next_id = ir.increase_bound_by(1);
	auto &type = set<SPIRType>(next_id, SPIRType(OpTypeStruct));
	type.basetype = SPIRType::Struct;

	InterfaceBlockMeta meta;
	for (auto *p_var : vars)
	{
		meta.strip_array = true;
		meta.allow_local_declaration = false;
		add_variable_to_interface_block(StorageClassOutput, "", type, *p_var, meta);
	}

	if (per_primitive)
		set_name(type.self, "spvPerPrimitive");
	else
		set_name(type.self, "spvPerVertex");

	return next_id;
}